

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void BrotliEncodeMlen(size_t length,uint64_t *bits,size_t *numbits,uint64_t *nibblesbits)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  if ((length == 1) || (uVar2 = (int)length - 1, uVar2 < 0x8000)) {
    uVar3 = 4;
  }
  else {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar3 = (ulong)((uVar1 ^ 0xffffffe0) + 0x24 >> 2);
  }
  *nibblesbits = uVar3 - 4;
  *numbits = (ulong)(uint)((int)uVar3 << 2);
  *bits = length - 1;
  return;
}

Assistant:

static void BrotliEncodeMlen(size_t length, uint64_t* bits,
                             size_t* numbits, uint64_t* nibblesbits) {
  size_t lg = (length == 1) ? 1 : Log2FloorNonZero((uint32_t)(length - 1)) + 1;
  size_t mnibbles = (lg < 16 ? 16 : (lg + 3)) / 4;
  BROTLI_DCHECK(length > 0);
  BROTLI_DCHECK(length <= (1 << 24));
  BROTLI_DCHECK(lg <= 24);
  *nibblesbits = mnibbles - 4;
  *numbits = mnibbles * 4;
  *bits = length - 1;
}